

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_printers.hpp
# Opt level: O0

void iutest::detail::PrintToFloatingPoint<long_double>
               (floating_point<long_double> *f,iu_ostream *os)

{
  undefined1 value [16];
  undefined8 uVar1;
  ostream *poVar2;
  detail *this;
  undefined8 extraout_RDX;
  floating_point<long_double> *this_00;
  char *this_01;
  undefined8 in_stack_fffffffffffffd88;
  iu_ostream *local_248;
  string local_208;
  string local_1e8 [32];
  longdouble local_1c8 [2];
  int local_1a4;
  stringstream local_1a0 [8];
  iu_stringstream ss;
  iu_ostream *os_local;
  floating_point<long_double> *f_local;
  
  ss._384_8_ = os;
  std::__cxx11::stringstream::stringstream(local_1a0);
  local_1a4 = (int)std::setprecision(0x14);
  this_00 = (floating_point<long_double> *)(ulong)(uint)local_1a4;
  std::operator<<((ostream *)&ss.field_0x8,(_Setprecision)local_1a4);
  floating_point<long_double>::raw((longdouble *)f,this_00);
  local_248 = (iu_ostream *)0x0;
  if (&stack0x00000000 != (undefined1 *)0x1a0) {
    local_248 = (iu_ostream *)&ss.field_0x8;
  }
  UniversalPrint<long_double>(local_1c8,local_248);
  uVar1 = ss._384_8_;
  std::__cxx11::stringstream::str();
  poVar2 = std::operator<<((ostream *)uVar1,local_1e8);
  this_01 = "(0x";
  poVar2 = std::operator<<(poVar2,"(0x");
  this = (detail *)
         floating_point<long_double>::bits((UInt *)f,(floating_point<long_double> *)this_01);
  value._8_8_ = extraout_RDX;
  value._0_8_ = in_stack_fffffffffffffd88;
  ToHexString<unsigned__int128>(&local_208,this,(unsigned___int128)value);
  poVar2 = std::operator<<(poVar2,(string *)&local_208);
  std::operator<<(poVar2,")");
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string(local_1e8);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return;
}

Assistant:

inline void PrintToFloatingPoint(const floating_point<T>& f, iu_ostream* os)
{
    iu_stringstream ss;
#if IUTEST_HAS_IOMANIP
    ss << ::std::setprecision(::std::numeric_limits<T>::digits10 + 2);
#endif
    UniversalPrint(f.raw(), &ss);
    *os << ss.str() << "(0x" << ToHexString(f.bits()) << ")";
}